

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distance.hpp
# Opt level: O1

float __thiscall hnsw::L2Distance::operator()(L2Distance *this,float *p1,float *p2)

{
  size_t *psVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  uint uVar7;
  long lVar8;
  undefined1 (*pauVar9) [32];
  undefined1 (*pauVar10) [32];
  ulong uVar11;
  uint uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar17 [16];
  undefined1 auVar16 [64];
  float sum;
  undefined1 auVar18 [16];
  
  psVar1 = &(this->super_Distance).num;
  *psVar1 = *psVar1 + 1;
  uVar11 = (this->super_Distance).dim_;
  uVar12 = (uint)uVar11;
  uVar7 = uVar12 & 0xf;
  auVar16 = ZEXT1664(ZEXT816(0) << 0x40);
  auVar14 = ZEXT1632(ZEXT816(0) << 0x40);
  uVar12 = uVar12 & 0xfffffff0;
  if ((uVar11 & 0xfffffff0) != 0) {
    lVar8 = 0;
    do {
      auVar15 = vsubps_avx(*(undefined1 (*) [32])(p1 + lVar8),*(undefined1 (*) [32])(p2 + lVar8));
      auVar6 = vsubps_avx(*(undefined1 (*) [32])(p1 + lVar8 + 8),
                          *(undefined1 (*) [32])(p2 + lVar8 + 8));
      auVar14._0_4_ = auVar16._0_4_ + auVar15._0_4_ * auVar15._0_4_ + auVar6._0_4_ * auVar6._0_4_;
      auVar14._4_4_ = auVar16._4_4_ + auVar15._4_4_ * auVar15._4_4_ + auVar6._4_4_ * auVar6._4_4_;
      auVar14._8_4_ = auVar16._8_4_ + auVar15._8_4_ * auVar15._8_4_ + auVar6._8_4_ * auVar6._8_4_;
      auVar14._12_4_ =
           auVar16._12_4_ + auVar15._12_4_ * auVar15._12_4_ + auVar6._12_4_ * auVar6._12_4_;
      auVar14._16_4_ =
           auVar16._16_4_ + auVar15._16_4_ * auVar15._16_4_ + auVar6._16_4_ * auVar6._16_4_;
      auVar14._20_4_ =
           auVar16._20_4_ + auVar15._20_4_ * auVar15._20_4_ + auVar6._20_4_ * auVar6._20_4_;
      auVar14._24_4_ =
           auVar16._24_4_ + auVar15._24_4_ * auVar15._24_4_ + auVar6._24_4_ * auVar6._24_4_;
      auVar14._28_4_ = auVar16._28_4_ + auVar15._28_4_ + auVar6._28_4_;
      auVar16 = ZEXT3264(auVar14);
      lVar8 = lVar8 + 0x10;
    } while ((uint)lVar8 < uVar12);
  }
  pauVar9 = (undefined1 (*) [32])(p1 + uVar12);
  pauVar10 = (undefined1 (*) [32])(p2 + uVar12);
  auVar15 = auVar14;
  if (7 < uVar7) {
    auVar6 = vsubps_avx(*pauVar9,*pauVar10);
    auVar15._0_4_ = auVar14._0_4_ + auVar6._0_4_ * auVar6._0_4_;
    auVar15._4_4_ = auVar14._4_4_ + auVar6._4_4_ * auVar6._4_4_;
    auVar15._8_4_ = auVar14._8_4_ + auVar6._8_4_ * auVar6._8_4_;
    auVar15._12_4_ = auVar14._12_4_ + auVar6._12_4_ * auVar6._12_4_;
    auVar15._16_4_ = auVar14._16_4_ + auVar6._16_4_ * auVar6._16_4_;
    auVar15._20_4_ = auVar14._20_4_ + auVar6._20_4_ * auVar6._20_4_;
    auVar15._24_4_ = auVar14._24_4_ + auVar6._24_4_ * auVar6._24_4_;
    auVar15._28_4_ = auVar14._28_4_ + auVar6._28_4_;
    uVar7 = uVar7 - 8;
    pauVar9 = pauVar9 + 1;
    pauVar10 = pauVar10 + 1;
  }
  auVar13 = auVar15._0_16_;
  auVar18 = vhaddps_avx(auVar13,auVar13);
  auVar3 = vshufpd_avx(auVar13,auVar13,1);
  auVar5 = vshufps_avx(auVar13,auVar13,0xff);
  auVar17 = auVar15._16_16_;
  auVar13 = vmovshdup_avx(auVar17);
  auVar4 = vshufpd_avx(auVar17,auVar17,1);
  auVar17 = vshufps_avx(auVar17,auVar17,0xff);
  fVar2 = auVar17._0_4_ +
          auVar4._0_4_ +
          auVar13._0_4_ + auVar15._16_4_ + auVar5._0_4_ + auVar3._0_4_ + auVar18._0_4_;
  if (uVar7 != 0) {
    auVar18._0_12_ = ZEXT812(0);
    auVar18._12_4_ = 0;
    uVar11 = 0;
    do {
      auVar13 = ZEXT416((uint)(*(float *)(*pauVar9 + uVar11 * 4) -
                              *(float *)(*pauVar10 + uVar11 * 4)));
      auVar18 = vfmadd231ss_fma(auVar18,auVar13,auVar13);
      uVar11 = uVar11 + 1;
    } while (uVar7 != uVar11);
    fVar2 = fVar2 + auVar18._0_4_;
  }
  return fVar2;
}

Assistant:

float operator()(const float *p1, const float *p2) const {
    num += 1;
#ifndef __AVX__
    return Sqr_(p1, p2, dim_);
#else
    float result = 0;

    __m256 sum;
    __m256 tmp0, tmp1;
    unsigned residual_size = dim_ % 16;
    unsigned aligned_size = dim_ - residual_size;
    const float *residual_start1 = p1 + aligned_size;
    const float *residual_start2 = p2 + aligned_size;
    float unpack[8] __attribute__((aligned(32))) = {0, 0, 0, 0, 0, 0, 0, 0};

    sum = _mm256_loadu_ps(unpack);

    const float *ptr1 = p1;
    const float *ptr2 = p2;
    for (unsigned i = 0; i < aligned_size; i += 16, ptr1 += 16, ptr2 += 16) {
      AVX_L2SQR(ptr1, ptr2, sum, tmp0, tmp1);
      AVX_L2SQR(ptr1 + 8, ptr2 + 8, sum, tmp0, tmp1);
    }
    if (residual_size >= 8) {
      AVX_L2SQR(residual_start1, residual_start2, sum, tmp0, tmp1);
      residual_size -= 8;
      residual_start1 += 8;
      residual_start2 += 8;
    }
    _mm256_storeu_ps(unpack, sum);
    result = unpack[0] + unpack[1] + unpack[2] + unpack[3] + unpack[4] + unpack[5] + unpack[6] +
             unpack[7];

    if (residual_size > 0) {
      result += Sqr_(residual_start1, residual_start2, residual_size);
    }
    return result;
#endif
  }

 private:
  float Sqr_(const float *p1, const float *p2, uint32_t size) const {
    // Auto vectorized with -O3 flag
    float sum = 0;
    for (size_t i = 0; i < size; i++) {
      float tmp = p1[i] - p2[i];
      sum += tmp * tmp;
    }
    return sum;
  }